

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O3

Response execute_command(PingCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  json_value extraout_RDX;
  Response RVar2;
  string local_30;
  json_value jVar1;
  
  bin_str_to_hex(&local_30,(string *)((snap->db_name)._M_pathname._M_dataplus._M_p + 8));
  RVar2 = Response::ping((Response *)cmd,&local_30);
  jVar1 = RVar2.content.m_value;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    jVar1 = extraout_RDX;
  }
  RVar2.content.m_value.string = jVar1.string;
  RVar2.content._0_8_ = cmd;
  return (Response)RVar2.content;
}

Assistant:

Response execute_command([[maybe_unused]] const PingCommand &cmd, Task *task,
                         [[maybe_unused]] const DatabaseSnapshot *snap) {
    return Response::ping(task->spec().hex_conn_id());
}